

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O3

void __thiscall
ElementsTransactionApi_FundRawTransaction_prod_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_prod_Test *this)

{
  pointer pcVar1;
  void *pvVar2;
  bool bVar3;
  uint32_t uVar4;
  char *pcVar5;
  long lVar6;
  Amount AVar7;
  initializer_list<cfd::UtxoData> __l;
  ConfidentialTransactionController ctx;
  ConfidentialAssetId asset2;
  ConfidentialAssetId asset1;
  ElementsTransactionApi api;
  UtxoFilter filter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  ConfidentialAssetId fee_asset;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ElementsAddressFactory factory;
  ConfidentialTransactionContext txc;
  CoinSelectionOption option;
  Amount estimate_fee;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  AssertionResult gtest_ar;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  string local_2248;
  undefined1 local_2228 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2220;
  ConfidentialTransaction local_2218;
  ConfidentialAssetId local_21d8;
  ConfidentialAssetId local_21b0;
  int64_t local_2188;
  UtxoFilter local_217c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2178;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  local_2158;
  ConfidentialAssetId local_2138;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_2110;
  AddressFactory local_20f8;
  undefined1 local_20d0 [216];
  CoinSelectionOption local_1ff8;
  Amount local_1f90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  local_1f80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f50;
  undefined1 local_1f20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f10 [81];
  UtxoData local_19f8;
  UtxoData local_14d0;
  undefined1 local_fa8 [40];
  Txid local_f80;
  uint32_t local_f60;
  Script local_f58 [2];
  Address local_ee8;
  undefined1 local_d68 [8];
  char *local_d60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d48;
  bool local_d40;
  AddressType local_d38;
  void *local_d30;
  ConfidentialAssetId local_d28 [17];
  undefined1 local_a80 [40];
  Txid local_a58;
  uint32_t local_a38;
  Script local_a30 [2];
  Address local_9c0;
  undefined1 local_840 [8];
  char *local_838;
  undefined **local_820;
  bool local_818;
  AddressType local_810;
  void *local_808;
  ConfidentialAssetId local_800 [17];
  UtxoData local_558;
  
  cfd::Initialize();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)&local_20f8,kLiquidV1);
  local_1f20 = (undefined1  [8])local_1f10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f20,"6f0279e9ed041c3d710a9f57d0c02928416460c4b722ae3457a11eec381c526d"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_21b0,(string *)local_1f20);
  if (local_1f20 != (undefined1  [8])local_1f10) {
    operator_delete((void *)local_1f20,local_1f10[0]._M_allocated_capacity + 1);
  }
  local_1f20 = (undefined1  [8])local_1f10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f20,"f59c5f3e8141f322276daa63ed5f307085808aea6d4ef9ba61e28154533fdec7"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_21d8,(string *)local_1f20);
  if (local_1f20 != (undefined1  [8])local_1f10) {
    operator_delete((void *)local_1f20,local_1f10[0]._M_allocated_capacity + 1);
  }
  cfd::UtxoData::UtxoData(&local_558);
  local_558.block_height = 0;
  local_558.binary_data = (void *)0x0;
  pcVar1 = local_a80 + 0x10;
  local_a80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a80,"cd4433fd3d014187050aefe878f76ab76aa8b1eef3ba965cb8dc76b0d271d002",
             "");
  cfd::core::Txid::Txid((Txid *)local_1f20,(string *)local_a80);
  cfd::core::Txid::operator=(&local_558.txid,(Txid *)local_1f20);
  local_1f20 = (undefined1  [8])&PTR__Txid_0086d9f8;
  pvVar2 = (void *)CONCAT71(local_1f18.ptr_._1_7_,local_1f18.ptr_._0_1_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_1f10[0]._8_8_ - (long)pvVar2);
  }
  if ((pointer)local_a80._0_8_ != pcVar1) {
    operator_delete((void *)local_a80._0_8_,local_a80._16_8_ + 1);
  }
  local_558.vout = 2;
  local_a80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a80,"0014860d7bed1010c2ccb5247889daa5c58023fa9f8d","");
  cfd::core::Script::Script((Script *)local_1f20,(string *)local_a80);
  cfd::core::Script::operator=(&local_558.locking_script,(Script *)local_1f20);
  cfd::core::Script::~Script((Script *)local_1f20);
  if ((pointer)local_a80._0_8_ != pcVar1) {
    operator_delete((void *)local_a80._0_8_,local_a80._16_8_ + 1);
  }
  local_a80._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a80,"ex1qscxhhmgszrpvedfy0zya4fw9sq3l48udevqlh2","");
  cfd::AddressFactory::GetAddress((Address *)local_1f20,&local_20f8,(string *)local_a80);
  cfd::core::Address::operator=(&local_558.address,(Address *)local_1f20);
  cfd::core::Address::~Address((Address *)local_1f20);
  if ((pointer)local_a80._0_8_ != pcVar1) {
    operator_delete((void *)local_a80._0_8_,local_a80._16_8_ + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_558.descriptor,0,(char *)local_558.descriptor._M_string_length,0x5ba615);
  cfd::core::Amount::Amount((Amount *)local_1f20,0xf4177);
  local_558.amount.ignore_check_ = local_1f18.ptr_._0_1_;
  local_558.amount.amount_ = (int64_t)local_1f20;
  local_558.address_type = kP2wpkhAddress;
  cfd::core::ConfidentialAssetId::operator=(&local_558.asset,&local_21b0);
  cfd::UtxoData::UtxoData((UtxoData *)local_a80);
  local_a80._0_8_ = (pointer)0x0;
  local_808 = (void *)0x0;
  pcVar1 = local_fa8 + 0x10;
  local_fa8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fa8,"62ac8a5272b67aab0ca60db859bed64729463de72ee1743fd7eb9c72f4437b06",
             "");
  cfd::core::Txid::Txid((Txid *)local_1f20,(string *)local_fa8);
  cfd::core::Txid::operator=(&local_a58,(Txid *)local_1f20);
  local_1f20 = (undefined1  [8])&PTR__Txid_0086d9f8;
  pvVar2 = (void *)CONCAT71(local_1f18.ptr_._1_7_,local_1f18.ptr_._0_1_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_1f10[0]._8_8_ - (long)pvVar2);
  }
  if ((pointer)local_fa8._0_8_ != pcVar1) {
    operator_delete((void *)local_fa8._0_8_,local_fa8._16_8_ + 1);
  }
  local_a38 = 0;
  local_fa8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fa8,"0014891fd3ada0038759b124189ed64ab2343f7de0b1","");
  cfd::core::Script::Script((Script *)local_1f20,(string *)local_fa8);
  cfd::core::Script::operator=(local_a30,(Script *)local_1f20);
  cfd::core::Script::~Script((Script *)local_1f20);
  if ((pointer)local_fa8._0_8_ != pcVar1) {
    operator_delete((void *)local_fa8._0_8_,local_fa8._16_8_ + 1);
  }
  local_fa8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fa8,"ex1q3y0a8tdqqwr4nvfyrz0dvj4jxslhmc93hzzdt9","");
  cfd::AddressFactory::GetAddress((Address *)local_1f20,&local_20f8,(string *)local_fa8);
  cfd::core::Address::operator=(&local_9c0,(Address *)local_1f20);
  cfd::core::Address::~Address((Address *)local_1f20);
  if ((pointer)local_fa8._0_8_ != pcVar1) {
    operator_delete((void *)local_fa8._0_8_,local_fa8._16_8_ + 1);
  }
  std::__cxx11::string::_M_replace((ulong)local_840,0,local_838,0x5ba6f7);
  cfd::core::Amount::Amount((Amount *)local_1f20,19999);
  local_818 = local_1f18.ptr_._0_1_;
  local_820 = (undefined **)local_1f20;
  local_810 = kP2wpkhAddress;
  cfd::core::ConfidentialAssetId::operator=(local_800,&local_21d8);
  cfd::UtxoData::UtxoData((UtxoData *)local_fa8);
  local_fa8._0_8_ = (pointer)0x0;
  local_d30 = (void *)0x0;
  pcVar1 = local_20d0 + 0x10;
  local_20d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20d0,"376906dfec46e2abc2c98cc4a51d725cb8bbc5ece38ae1127c90802823202988"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1f20,(string *)local_20d0);
  cfd::core::Txid::operator=(&local_f80,(Txid *)local_1f20);
  local_1f20 = (undefined1  [8])&PTR__Txid_0086d9f8;
  pvVar2 = (void *)CONCAT71(local_1f18.ptr_._1_7_,local_1f18.ptr_._0_1_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_1f10[0]._8_8_ - (long)pvVar2);
  }
  if ((pointer)local_20d0._0_8_ != pcVar1) {
    operator_delete((void *)local_20d0._0_8_,local_20d0._16_8_ + 1);
  }
  local_f60 = 2;
  local_20d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20d0,"001495f728a019f3ecc3725479b32b230de51df74d4a","");
  cfd::core::Script::Script((Script *)local_1f20,(string *)local_20d0);
  cfd::core::Script::operator=(local_f58,(Script *)local_1f20);
  cfd::core::Script::~Script((Script *)local_1f20);
  if ((pointer)local_20d0._0_8_ != pcVar1) {
    operator_delete((void *)local_20d0._0_8_,local_20d0._16_8_ + 1);
  }
  local_20d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20d0,"ex1qjhmj3gqe70kvxuj50xejkgcdu5wlwn225d0cu6","");
  cfd::AddressFactory::GetAddress((Address *)local_1f20,&local_20f8,(string *)local_20d0);
  cfd::core::Address::operator=(&local_ee8,(Address *)local_1f20);
  cfd::core::Address::~Address((Address *)local_1f20);
  if ((pointer)local_20d0._0_8_ != pcVar1) {
    operator_delete((void *)local_20d0._0_8_,local_20d0._16_8_ + 1);
  }
  std::__cxx11::string::_M_replace((ulong)local_d68,0,local_d60,0x5ba7d9);
  cfd::core::Amount::Amount((Amount *)local_1f20,1);
  local_d40 = local_1f18.ptr_._0_1_;
  local_d48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f20;
  local_d38 = kP2wpkhAddress;
  cfd::core::ConfidentialAssetId::operator=(local_d28,&local_21d8);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_2138,&local_21b0);
  local_1f80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1f80._M_impl.super__Rb_tree_header._M_header;
  local_1f80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1f80._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_1f20,&local_21b0);
  cfd::core::Amount::Amount((Amount *)local_20d0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_1f80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f20,
             (Amount *)local_20d0);
  if (local_1f20 != (undefined1  [8])local_1f10) {
    operator_delete((void *)local_1f20,local_1f10[0]._M_allocated_capacity + 1);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_1f20,&local_21d8);
  cfd::core::Amount::Amount((Amount *)local_20d0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_1f80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f20,
             (Amount *)local_20d0);
  if (local_1f20 != (undefined1  [8])local_1f10) {
    operator_delete((void *)local_1f20,local_1f10[0]._M_allocated_capacity + 1);
  }
  local_1f50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1f50._M_impl.super__Rb_tree_header._M_header;
  local_1f50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1f50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1f50._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_1f20,&local_21b0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,char_const(&)[102]>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_1f50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f20,
             (char (*) [102])
             "lq1qqgv5wwfp4h0pfnyy2kkxl0kg3qnahcpfq7emrxu9xusz879axq0spg9cxu8wf72ktsft5r8vxnkfd8s5kmg32fvy8texp5p6s"
            );
  if (local_1f20 != (undefined1  [8])local_1f10) {
    operator_delete((void *)local_1f20,local_1f10[0]._M_allocated_capacity + 1);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_1f20,&local_21d8);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,char_const(&)[102]>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_1f50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f20,
             (char (*) [102])
             "lq1qqwqawne0jyc2swqv9qp8fstrgxuux2824zxkqew9gdak4yudxvwhha0kwdv2p3j0lyekhchrzmuekp94fpfp6fkeggjkerfr8"
            );
  if (local_1f20 != (undefined1  [8])local_1f10) {
    operator_delete((void *)local_1f20,local_1f10[0]._M_allocated_capacity + 1);
  }
  local_2158.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2158.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2158.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Amount::Amount(&local_1f90);
  local_2178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption(&local_1ff8);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(&local_1ff8);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&local_1ff8,0.11);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(&local_1ff8,0.11);
  cfd::CoinSelectionOption::SetFeeAsset(&local_1ff8,&local_2138);
  cfd::CoinSelectionOption::SetBlindInfo(&local_1ff8,0,0x34);
  cfd::CoinSelectionOption::SetKnapsackMinimumChange(&local_1ff8,0);
  local_1f20 = (undefined1  [8])local_1f10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f20,
             "0200000000000101c7de3f535481e261baf94e6dea8a808570305fed63aa6d2722f341813e5f9cf5010000000000004e20021f70a7514c145cfb01c8751b92ac5b3518d585afb256dae9bc4be464bf546ac616001429aa90ad4af8ef2859d0573e69cf567957ea330000000000"
             ,"");
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_20d0,(string *)local_1f20);
  if (local_1f20 != (undefined1  [8])local_1f10) {
    operator_delete((void *)local_1f20,local_1f10[0]._M_allocated_capacity + 1);
  }
  cfd::UtxoData::UtxoData((UtxoData *)local_1f20,&local_558);
  cfd::UtxoData::UtxoData(&local_19f8,(UtxoData *)local_a80);
  cfd::UtxoData::UtxoData(&local_14d0,(UtxoData *)local_fa8);
  __l._M_len = 3;
  __l._M_array = (iterator)local_1f20;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_2110,__l,(allocator_type *)local_2228);
  lVar6 = 0xa50;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_1f20 + lVar6));
    lVar6 = lVar6 + -0x528;
  } while (lVar6 != -0x528);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_1f20,(AbstractTransaction *)local_20d0);
  cfd::api::ElementsTransactionApi::FundRawTransaction
            ((ConfidentialTransactionController *)local_2228,(ElementsTransactionApi *)&local_2188,
             (string *)local_1f20,&local_2110,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
              *)&local_1f80,&local_2158,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_1f50,&local_2138,true,0.11,&local_1f90,&local_217c,&local_1ff8,&local_2178,
             kCfdOutOfRangeError,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,(Amount *)0x0);
  if (local_1f20 != (undefined1  [8])local_1f10) {
    operator_delete((void *)local_1f20,local_1f10[0]._M_allocated_capacity + 1);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            (&local_2248,(AbstractTransactionController *)local_2228);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_1f20,&local_2248);
  cfd::ConfidentialTransactionContext::operator=
            ((ConfidentialTransactionContext *)local_20d0,
             (ConfidentialTransactionContext *)local_1f20);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_1f20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2248._M_dataplus._M_p != &local_2248.field_2) {
    operator_delete(local_2248._M_dataplus._M_p,local_2248.field_2._M_allocated_capacity + 1);
  }
  local_2228 = (undefined1  [8])&PTR__ConfidentialTransactionController_0086d980;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_2218);
  AVar7 = cfd::ConfidentialTransactionContext::GetFeeAmount
                    ((ConfidentialTransactionContext *)local_20d0,(ConfidentialAssetId *)0x0);
  local_2228 = (undefined1  [8])AVar7.amount_;
  local_2220.ptr_._0_1_ = AVar7.ignore_check_;
  local_2248._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue((Amount *)local_2228);
  local_2188 = cfd::core::Amount::GetSatoshiValue(&local_1f90);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_1f20,"txc.GetFeeAmount().GetSatoshiValue()",
             "estimate_fee.GetSatoshiValue()",(long *)&local_2248,&local_2188);
  if (local_1f20[0] == (string)0x0) {
    testing::Message::Message((Message *)local_2228);
    if ((undefined8 *)CONCAT71(local_1f18.ptr_._1_7_,local_1f18.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_1f18.ptr_._1_7_,local_1f18.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x52d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2248,(Message *)local_2228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2248);
    if (local_2228 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2228 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_2228 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1f18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_1f20,(AbstractTransaction *)local_20d0);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2228,"txc.GetHex().c_str()",
             "\"02000000000302d071d2b076dcb85c96baf3eeb1a86ab76af778e8ef0a058741013dfd3344cd0200000000ffffffff067b43f4729cebd73f74e12ee73d462947d6be59b80da60cab7ab672528aac620000000000ffffffff882920232880907c12e18ae3ecc5bbb85c721da5c48cc9c2abe246ecdf0669370200000000ffffffff0301c7de3f535481e261baf94e6dea8a808570305fed63aa6d2722f341813e5f9cf5010000000000004e20021f70a7514c145cfb01c8751b92ac5b3518d585afb256dae9bc4be464bf546ac616001429aa90ad4af8ef2859d0573e69cf567957ea3300016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000001250000016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000f40520219473921adde14cc8455ac6fbec88827dbe02907b3b19b85372023f8bd301f00160014a0b8370ee4f9565c12ba0cec34ec969e14b6d11500000000\""
             ,(char *)local_1f20,
             "02000000000302d071d2b076dcb85c96baf3eeb1a86ab76af778e8ef0a058741013dfd3344cd0200000000ffffffff067b43f4729cebd73f74e12ee73d462947d6be59b80da60cab7ab672528aac620000000000ffffffff882920232880907c12e18ae3ecc5bbb85c721da5c48cc9c2abe246ecdf0669370200000000ffffffff0301c7de3f535481e261baf94e6dea8a808570305fed63aa6d2722f341813e5f9cf5010000000000004e20021f70a7514c145cfb01c8751b92ac5b3518d585afb256dae9bc4be464bf546ac616001429aa90ad4af8ef2859d0573e69cf567957ea3300016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000001250000016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000f40520219473921adde14cc8455ac6fbec88827dbe02907b3b19b85372023f8bd301f00160014a0b8370ee4f9565c12ba0cec34ec969e14b6d11500000000"
            );
  if (local_1f20 != (undefined1  [8])local_1f10) {
    operator_delete((void *)local_1f20,local_1f10[0]._M_allocated_capacity + 1);
  }
  if (local_2228[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_1f20);
    if ((undefined8 *)CONCAT71(local_2220.ptr_._1_7_,local_2220.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_2220.ptr_._1_7_,local_2220.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x52e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2248,(Message *)local_1f20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2248);
    if (local_1f20 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_1f20 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_1f20 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2220,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_20d0);
  local_2228._0_4_ = uVar4;
  local_2248._M_dataplus._M_p._0_4_ = 0x176;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_1f20,"txc.GetVsize()","374",(uint *)local_2228,(int *)&local_2248);
  if (local_1f20[0] == (string)0x0) {
    testing::Message::Message((Message *)local_2228);
    if ((undefined8 *)CONCAT71(local_1f18.ptr_._1_7_,local_1f18.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT71(local_1f18.ptr_._1_7_,local_1f18.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x52f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2248,(Message *)local_2228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2248);
    if (local_2228 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2228 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_2228 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1f18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_2110);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_20d0);
  local_1ff8.fee_asset_._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0086dd08
  ;
  if (local_1ff8.fee_asset_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1ff8.fee_asset_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1ff8.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1ff8.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2178);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&local_2158);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1f50);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~_Rb_tree(&local_1f80);
  local_2138._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0086dd08;
  if (local_2138.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2138.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2138.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2138.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cfd::UtxoData::~UtxoData((UtxoData *)local_fa8);
  cfd::UtxoData::~UtxoData((UtxoData *)local_a80);
  cfd::UtxoData::~UtxoData(&local_558);
  local_21d8._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0086dd08;
  if (local_21d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_21d8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_21d8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_21d8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_21b0._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0086dd08;
  if (local_21b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_21b0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_21b0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_21b0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_20f8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_0086bad8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_20f8.prefix_list_);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_prod) {
  cfd::Initialize();
  ElementsAddressFactory factory(NetType::kLiquidV1);
  ConfidentialAssetId asset1("6f0279e9ed041c3d710a9f57d0c02928416460c4b722ae3457a11eec381c526d");
  ConfidentialAssetId asset2("f59c5f3e8141f322276daa63ed5f307085808aea6d4ef9ba61e28154533fdec7");
  // Address1
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("cd4433fd3d014187050aefe878f76ab76aa8b1eef3ba965cb8dc76b0d271d002");
  utxo1.vout = 2;
  utxo1.locking_script = Script("0014860d7bed1010c2ccb5247889daa5c58023fa9f8d");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("ex1qscxhhmgszrpvedfy0zya4fw9sq3l48udevqlh2");
  utxo1.descriptor = "wpkh(02db28ad892aa1e500d1e88ffa24200088bc82a8a87807cd13a1d1a1c7799c41e5)";
  utxo1.amount = Amount(int64_t{999799});
  utxo1.address_type = AddressType::kP2wpkhAddress;
  utxo1.asset = asset1;

  // Address2
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("62ac8a5272b67aab0ca60db859bed64729463de72ee1743fd7eb9c72f4437b06");
  utxo2.vout = 0;
  utxo2.locking_script = Script("0014891fd3ada0038759b124189ed64ab2343f7de0b1");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("ex1q3y0a8tdqqwr4nvfyrz0dvj4jxslhmc93hzzdt9");
  utxo2.descriptor = "wpkh(023004f49c61a63e339fa554e218774d6b4752bbfcfca61fe1c567b96af196b524)";
  utxo2.amount = Amount(int64_t{19999});
  utxo2.address_type = AddressType::kP2wpkhAddress;
  utxo2.asset = asset2;

  // Address3
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("376906dfec46e2abc2c98cc4a51d725cb8bbc5ece38ae1127c90802823202988");
  utxo3.vout = 2;
  utxo3.locking_script = Script("001495f728a019f3ecc3725479b32b230de51df74d4a");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("ex1qjhmj3gqe70kvxuj50xejkgcdu5wlwn225d0cu6");
  utxo3.descriptor = "wpkh(02272bcdbec1c0a2170e72f2d8cf42188d59ea7eae9296d60d435af3fe465d9bb5)";
  utxo3.amount = Amount(int64_t{1});
  utxo3.address_type = AddressType::kP2wpkhAddress;
  utxo3.asset = asset2;

  double fee_rate = 0.11;
  ConfidentialAssetId fee_asset = asset1;
  std::map<std::string, Amount> map_target_value;
  map_target_value.emplace(asset1.GetHex(), Amount());
  map_target_value.emplace(asset2.GetHex(), Amount());
  std::map<std::string, std::string> reserve_txout_address;
  reserve_txout_address.emplace(asset1.GetHex(), "lq1qqgv5wwfp4h0pfnyy2kkxl0kg3qnahcpfq7emrxu9xusz879axq0spg9cxu8wf72ktsft5r8vxnkfd8s5kmg32fvy8texp5p6s");
  reserve_txout_address.emplace(asset2.GetHex(), "lq1qqwqawne0jyc2swqv9qp8fstrgxuux2824zxkqew9gdak4yudxvwhha0kwdv2p3j0lyekhchrzmuekp94fpfp6fkeggjkerfr8");
  std::vector<ElementsUtxoAndOption> selected_txin_utxos;
  Amount estimate_fee;
  UtxoFilter filter;
  std::vector<std::string> append_txout_addresses;
  CoinSelectionOption option;
  option.InitializeConfidentialTxSizeInfo();
  option.SetEffectiveFeeBaserate(fee_rate);
  option.SetLongTermFeeBaserate(fee_rate);
  option.SetFeeAsset(fee_asset);
  option.SetBlindInfo(0, 52);
  option.SetKnapsackMinimumChange(0);

  ConfidentialTransactionContext txc("0200000000000101c7de3f535481e261baf94e6dea8a808570305fed63aa6d2722f341813e5f9cf5010000000000004e20021f70a7514c145cfb01c8751b92ac5b3518d585afb256dae9bc4be464bf546ac616001429aa90ad4af8ef2859d0573e69cf567957ea330000000000");
  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  try {
    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        txc.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kLiquidV1);
    txc = ConfidentialTransactionContext(ctx.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(txc.GetHex().c_str(), "02000000000302d071d2b076dcb85c96baf3eeb1a86ab76af778e8ef0a058741013dfd3344cd0200000000ffffffff067b43f4729cebd73f74e12ee73d462947d6be59b80da60cab7ab672528aac620000000000ffffffff882920232880907c12e18ae3ecc5bbb85c721da5c48cc9c2abe246ecdf0669370200000000ffffffff0301c7de3f535481e261baf94e6dea8a808570305fed63aa6d2722f341813e5f9cf5010000000000004e20021f70a7514c145cfb01c8751b92ac5b3518d585afb256dae9bc4be464bf546ac616001429aa90ad4af8ef2859d0573e69cf567957ea3300016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000001250000016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f0100000000000f40520219473921adde14cc8455ac6fbec88827dbe02907b3b19b85372023f8bd301f00160014a0b8370ee4f9565c12ba0cec34ec969e14b6d11500000000");
  EXPECT_EQ(txc.GetVsize(), 374);
}